

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Print<char[16],std::basic_string_view<char,std::char_traits<char>>>
          (Printer *this,string_view text,char (*args) [16],
          basic_string_view<char,_std::char_traits<char>_> *args_1)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  map;
  string_view vars [3];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::iterator,_bool>
  local_40;
  
  vars[0]._M_len = strlen(*args);
  vars[1]._M_len = args_1->_M_len;
  vars[1]._M_str = args_1->_M_str;
  vars[2]._M_len = 0;
  vars[2]._M_str = anon_var_dwarf_651463 + 5;
  map.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  map.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  map.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  vars[0]._M_str = *args;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::reserve((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             *)&map,1);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::
  emplace<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>_&,_0>
            (&local_40,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)&map,vars,vars + 1);
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>>
            (this,&map,text);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)&map);
  return;
}

Assistant:

void Printer::Print(absl::string_view text, const Args&... args) {
  static_assert(sizeof...(args) % 2 == 0, "");

  // Include an extra arg, since a zero-length array is ill-formed, and
  // MSVC complains.
  absl::string_view vars[] = {args..., ""};
  absl::flat_hash_map<absl::string_view, absl::string_view> map;
  map.reserve(sizeof...(args) / 2);
  for (size_t i = 0; i < sizeof...(args); i += 2) {
    map.emplace(vars[i], vars[i + 1]);
  }

  Print(map, text);
}